

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v7::detail::fill<char*,char>(char *it,size_t n,fill_t<char> *fill)

{
  byte bVar1;
  unsigned_long __n2;
  ulong __n;
  bool bVar2;
  
  bVar1 = fill->size_;
  __n = (ulong)bVar1;
  if (__n == 1) {
    if (n != 0) {
      memset(it,(uint)(byte)fill->data_[0],n);
      it = it + n;
    }
  }
  else {
    while (bVar2 = n != 0, n = n - 1, bVar2) {
      if (bVar1 != 0) {
        memmove(it,fill,__n);
      }
      it = it + __n;
    }
  }
  return it;
}

Assistant:

FMT_NOINLINE OutputIt fill(OutputIt it, size_t n, const fill_t<Char>& fill) {
  auto fill_size = fill.size();
  if (fill_size == 1) return std::fill_n(it, n, fill[0]);
  for (size_t i = 0; i < n; ++i) it = std::copy_n(fill.data(), fill_size, it);
  return it;
}